

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

int emit_dqt(j_compress_ptr cinfo,int index)

{
  ushort uVar1;
  JQUANT_TBL *pJVar2;
  int local_3c;
  int local_28;
  uint qval;
  int i;
  int prec;
  JQUANT_TBL *qtbl;
  int index_local;
  j_compress_ptr cinfo_local;
  
  pJVar2 = cinfo->quant_tbl_ptrs[index];
  if (pJVar2 == (JQUANT_TBL *)0x0) {
    cinfo->err->msg_code = 0x36;
    (cinfo->err->msg_parm).i[0] = index;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  qval = 0;
  for (local_28 = 0; local_28 <= cinfo->lim_Se; local_28 = local_28 + 1) {
    if (0xff < pJVar2->quantval[cinfo->natural_order[local_28]]) {
      qval = 1;
    }
  }
  if (pJVar2->sent_table == 0) {
    emit_marker(cinfo,M_DQT);
    if (qval == 0) {
      local_3c = cinfo->lim_Se + 4;
    }
    else {
      local_3c = cinfo->lim_Se * 2 + 5;
    }
    emit_2bytes(cinfo,local_3c);
    emit_byte(cinfo,index + qval * 0x10);
    for (local_28 = 0; local_28 <= cinfo->lim_Se; local_28 = local_28 + 1) {
      uVar1 = pJVar2->quantval[cinfo->natural_order[local_28]];
      if (qval != 0) {
        emit_byte(cinfo,(uint)(uVar1 >> 8));
      }
      emit_byte(cinfo,uVar1 & 0xff);
    }
    pJVar2->sent_table = 1;
  }
  return qval;
}

Assistant:

LOCAL(int)
emit_dqt (j_compress_ptr cinfo, int index)
/* Emit a DQT marker */
/* Returns the precision used (0 = 8bits, 1 = 16bits) for baseline checking */
{
  JQUANT_TBL * qtbl = cinfo->quant_tbl_ptrs[index];
  int prec;
  int i;

  if (qtbl == NULL)
    ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, index);

  prec = 0;
  for (i = 0; i <= cinfo->lim_Se; i++) {
    if (qtbl->quantval[cinfo->natural_order[i]] > 255)
      prec = 1;
  }

  if (! qtbl->sent_table) {
    emit_marker(cinfo, M_DQT);

    emit_2bytes(cinfo,
      prec ? cinfo->lim_Se * 2 + 2 + 1 + 2 : cinfo->lim_Se + 1 + 1 + 2);

    emit_byte(cinfo, index + (prec<<4));

    for (i = 0; i <= cinfo->lim_Se; i++) {
      /* The table entries must be emitted in zigzag order. */
      unsigned int qval = qtbl->quantval[cinfo->natural_order[i]];
      if (prec)
	emit_byte(cinfo, (int) (qval >> 8));
      emit_byte(cinfo, (int) (qval & 0xFF));
    }

    qtbl->sent_table = TRUE;
  }

  return prec;
}